

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O0

void Lpk_IfManStart(Lpk_Man_t *p)

{
  If_Par_t *pPars_00;
  If_Man_t *pIVar1;
  float *pfVar2;
  If_Par_t *pPars;
  Lpk_Man_t *p_local;
  
  if (p->pIfMan == (If_Man_t *)0x0) {
    pPars_00 = (If_Par_t *)malloc(0x150);
    memset(pPars_00,0,0x150);
    pPars_00->nLutSize = p->pPars->nLutSize;
    pPars_00->nCutsMax = 0x10;
    pPars_00->nFlowIters = 0;
    pPars_00->nAreaIters = 0;
    pPars_00->DelayTarget = -1.0;
    pPars_00->Epsilon = 0.005;
    pPars_00->fPreprocess = 0;
    pPars_00->fArea = 1;
    pPars_00->fFancy = 0;
    pPars_00->fExpRed = 0;
    pPars_00->fLatchPaths = 0;
    pPars_00->fVerbose = 0;
    pPars_00->fTruth = 1;
    pPars_00->fUsePerm = 0;
    pPars_00->nLatchesCi = 0;
    pPars_00->nLatchesCo = 0;
    pPars_00->pLutLib = (If_LibLut_t *)0x0;
    pPars_00->pTimesArr = (float *)0x0;
    pPars_00->pTimesArr = (float *)0x0;
    pPars_00->fUseBdds = 0;
    pPars_00->fUseSops = 0;
    pPars_00->fUseCnfs = 0;
    pPars_00->fUseMv = 0;
    pIVar1 = If_ManStart(pPars_00);
    p->pIfMan = pIVar1;
    If_ManSetupSetAll(p->pIfMan,1000);
    pfVar2 = (float *)malloc(0x80);
    p->pIfMan->pPars->pTimesArr = pfVar2;
    return;
  }
  __assert_fail("p->pIfMan == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkCore.c"
                ,0x7e,"void Lpk_IfManStart(Lpk_Man_t *)");
}

Assistant:

void Lpk_IfManStart( Lpk_Man_t * p )
{
    If_Par_t * pPars;
    assert( p->pIfMan == NULL );
    // set defaults
    pPars = ABC_ALLOC( If_Par_t, 1 );
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  p->pPars->nLutSize;
    pPars->nCutsMax    = 16;
    pPars->nFlowIters  =  0; // 1
    pPars->nAreaIters  =  0; // 1 
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fPreprocess =  0;
    pPars->fArea       =  1;
    pPars->fFancy      =  0;
    pPars->fExpRed     =  0; //
    pPars->fLatchPaths =  0;
    pPars->fVerbose    =  0;
    // internal parameters
    pPars->fTruth      =  1;
    pPars->fUsePerm    =  0; 
    pPars->nLatchesCi  =  0;
    pPars->nLatchesCo  =  0;
    pPars->pLutLib     =  NULL; // Abc_FrameReadLibLut();
    pPars->pTimesArr   =  NULL; 
    pPars->pTimesArr   =  NULL;   
    pPars->fUseBdds    =  0;
    pPars->fUseSops    =  0;
    pPars->fUseCnfs    =  0;
    pPars->fUseMv      =  0;
    // start the mapping manager and set its parameters
    p->pIfMan = If_ManStart( pPars );
    If_ManSetupSetAll( p->pIfMan, 1000 );
    p->pIfMan->pPars->pTimesArr = ABC_ALLOC( float, 32 );
}